

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button,float lock_threshold)

{
  ImVec2 *mouse_pos;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  ImVec2 *mouse_pos_00;
  ImVec2 IVar5;
  
  pIVar3 = GImGui;
  if ((uint)button < 5) {
    if (lock_threshold < 0.0) {
      lock_threshold = (GImGui->IO).MouseDragThreshold;
    }
    if ((((GImGui->IO).MouseDown[(uint)button] != false) ||
        (IVar5.x = 0.0, IVar5.y = 0.0, (GImGui->IO).MouseReleased[(uint)button] == true)) &&
       (IVar5.x = 0.0, IVar5.y = 0.0,
       lock_threshold * lock_threshold <= (GImGui->IO).MouseDragMaxDistanceSqr[(uint)button])) {
      mouse_pos = &(GImGui->IO).MousePos;
      bVar4 = IsMousePosValid(mouse_pos);
      if (bVar4) {
        mouse_pos_00 = (pIVar3->IO).MouseClickedPos + (uint)button;
        bVar4 = IsMousePosValid(mouse_pos_00);
        IVar5.x = 0.0;
        IVar5.y = 0.0;
        if (bVar4) {
          IVar1 = *mouse_pos;
          IVar2 = *mouse_pos_00;
          IVar5.x = IVar1.x - IVar2.x;
          IVar5.y = IVar1.y - IVar2.y;
        }
      }
      else {
        IVar5.x = 0.0;
        IVar5.y = 0.0;
      }
    }
    return IVar5;
  }
  __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*g.IO.MouseDown)))",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x11dd,"ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton, float)");
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button] || g.IO.MouseReleased[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            if (IsMousePosValid(&g.IO.MousePos) && IsMousePosValid(&g.IO.MouseClickedPos[button]))
                return g.IO.MousePos - g.IO.MouseClickedPos[button];
    return ImVec2(0.0f, 0.0f);
}